

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::CodeGeneratorRequest::Clear(CodeGeneratorRequest *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  CodeGeneratorRequest *this_local;
  
  if ((((this->_has_bits_[0] & 0x1fe) != 0) && (bVar1 = has_parameter(this), bVar1)) &&
     (this->parameter_ != (string *)internal::kEmptyString_abi_cxx11_)) {
    std::__cxx11::string::clear();
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->file_to_generate_);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::Clear(&this->proto_file_);
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void CodeGeneratorRequest::Clear() {
  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (has_parameter()) {
      if (parameter_ != &::google::protobuf::internal::kEmptyString) {
        parameter_->clear();
      }
    }
  }
  file_to_generate_.Clear();
  proto_file_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}